

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawBlock
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,bool inRootFrame)

{
  QTextCursor *this_00;
  double dVar1;
  Selection *pSVar2;
  QTextDocument *this_01;
  PrivateShared *pPVar3;
  qreal qVar4;
  qreal qVar5;
  Data *pDVar6;
  Data *this_02;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Type TVar12;
  QTextLayout *this_03;
  QTextFrame *pQVar13;
  QTextFrameLayoutData *data;
  long lVar14;
  QTextCharFormat *selectionFormat;
  QTextObject *pQVar15;
  QPen *p;
  QBrush *pQVar16;
  QVariant *v;
  int iVar17;
  ulong uVar18;
  int iVar19;
  QTextFormat *pQVar20;
  QTextCharFormat *pQVar21;
  long in_FS_OFFSET;
  bool bVar22;
  double dVar23;
  QTextEngine *pQVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QTextLine QVar28;
  QPointF QVar29;
  QSizeF QVar30;
  QTextLength QVar31;
  QPen oldPen;
  QBrush bg;
  undefined1 local_150 [8];
  QString local_148;
  QPen local_130;
  QArrayDataPointer<QTextLayout::FormatRange> local_128;
  QBrush local_108;
  undefined1 local_100 [8];
  QRectF local_f8;
  undefined1 local_d0 [16];
  QDebug local_c0;
  undefined1 local_b8 [12];
  undefined4 uStack_ac;
  qint32 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QTextFormat local_88;
  QTextFormat local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = QTextBlock::layout(bl);
  local_a8 = -1;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_b8._8_4_ = 0xffffffff;
  local_b8._0_8_ = 0xffffffffffffffff;
  uStack_ac = 0xffffffff;
  QTextLayout::boundingRect((QRectF *)local_b8,this_03);
  QVar29 = QTextLayout::position(this_03);
  dVar23 = QVar29.yp + offset->yp + (double)stack0xffffffffffffff50;
  local_b8._8_4_ = SUB84(dVar23,0);
  local_b8._0_8_ = QVar29.xp + offset->xp + (double)local_b8._0_8_;
  uStack_ac = (int)((ulong)dVar23 >> 0x20);
  bVar7 = QTextBlock::isVisible(bl);
  local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
  if (!bVar7) goto LAB_004f10d7;
  if ((0.0 < (context->clip).w) && (dVar23 = (context->clip).h, 0.0 < dVar23)) {
    dVar1 = (context->clip).yp;
    local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
    if (((double)CONCAT44(uStack_9c,uStack_a0) + (double)stack0xffffffffffffff50 < dVar1) ||
       (local_58._16_8_ = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_),
       dVar23 + dVar1 < (double)stack0xffffffffffffff50)) goto LAB_004f10d7;
  }
  lcDraw();
  if (((byte)lcDraw::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    pcStack_40 = lcDraw::category.name;
    QMessageLogger::debug();
    pDVar6 = local_148.d.d;
    QVar25.m_data = (storage_type *)0x9;
    QVar25.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar25);
    QTextStream::operator<<((QTextStream *)pDVar6,(QString *)&local_f8);
    if ((QArrayData *)local_f8.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.xp,2,0x10);
      }
    }
    if ((char)(((QArrayData *)((long)local_148.d.d + 0x30))->ref_)._q_value.super___atomic_base<int>
              ._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_148.d.d,' ');
    }
    iVar8 = QTextBlock::position(bl);
    QTextStream::operator<<((QTextStream *)local_148.d.d,iVar8);
    if ((char)(((QArrayData *)((long)local_148.d.d + 0x30))->ref_)._q_value.super___atomic_base<int>
              ._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_148.d.d,' ');
    }
    pDVar6 = local_148.d.d;
    QVar26.m_data = (storage_type *)0x2;
    QVar26.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar26);
    QTextStream::operator<<((QTextStream *)pDVar6,(QString *)&local_f8);
    if ((QArrayData *)local_f8.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.xp,2,0x10);
      }
    }
    if ((char)(((QArrayData *)((long)local_148.d.d + 0x30))->ref_)._q_value.super___atomic_base<int>
              ._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_148.d.d,' ');
    }
    local_d0._0_8_ = local_148.d.d;
    *(int *)((long)local_148.d.d + 0x28) = *(int *)((long)local_148.d.d + 0x28) + 1;
    ::operator<<((QDebug *)&local_128,(QPointF *)local_d0);
    this_02 = local_128.d;
    QVar27.m_data = (storage_type *)0x2;
    QVar27.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar27);
    QTextStream::operator<<((QTextStream *)this_02,(QString *)&local_f8);
    if ((QArrayData *)local_f8.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.xp,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_128.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_128.d,' ');
    }
    local_d0._8_8_ = local_128.d;
    *(int *)((long)local_128.d + 0x28) = *(int *)((long)local_128.d + 0x28) + 1;
    QTextLayout::boundingRect(&local_f8,this_03);
    ::operator<<((QDebug *)&local_c0,(QRectF *)(local_d0 + 8));
    QDebug::~QDebug(&local_c0);
    QDebug::~QDebug((QDebug *)(local_d0 + 8));
    QDebug::~QDebug((QDebug *)&local_128);
    QDebug::~QDebug((QDebug *)local_d0);
    QDebug::~QDebug((QDebug *)(local_150 + 8));
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_68);
  local_100 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::brushProperty((QTextFormat *)local_100,(int)(QTextBlock *)local_68);
  bVar7 = QBrush::doCompareEqualStyle((QBrush *)local_100,NoBrush);
  if (!bVar7) {
    pcStack_40 = (char *)CONCAT44(uStack_9c,uStack_a0);
    local_58._16_4_ = local_a8;
    local_58._20_4_ = uStack_a4;
    pQVar13 = (QTextFrame *)CONCAT44(uStack_a4,local_a8);
    local_58._0_4_ = local_b8._0_4_;
    local_58._4_4_ = local_b8._4_4_;
    local_58._8_4_ = local_b8._8_4_;
    local_58._12_4_ = local_b8._12_4_;
    if (inRootFrame) {
      QVar30 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
      pQVar13 = (QTextFrame *)CONCAT44(local_58._20_4_,local_58._16_4_);
      if (QVar30.wd <= 0.0) {
        pQVar13 = QTextDocument::rootFrame
                            ((this->super_QAbstractTextDocumentLayoutPrivate).document);
        data = QTextFrame::layoutData(pQVar13);
        if (data == (QTextFrameLayoutData *)0x0) {
          lVar14 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar14 == 0) {
            data = (QTextFrameLayoutData *)operator_new(0x78);
            data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
            data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
            data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          }
          else {
            data = (QTextFrameLayoutData *)operator_new(0x160);
            data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
            data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
            data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            memset(data + 0x11,0,0xc0);
          }
          QTextFrame::setLayoutData(pQVar13,data);
        }
        pQVar13 = (QTextFrame *)
                  ((double)(*(int *)&data[2]._vptr_QTextFrameLayoutData -
                           *(int *)((long)&data[4]._vptr_QTextFrameLayoutData + 4)) * 0.015625 -
                  (double)CONCAT44(local_58._4_4_,local_58._0_4_));
      }
    }
    local_58._16_8_ = pQVar13;
    bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x1060);
    if (!bVar7) {
      QBrush::QBrush(&local_108,(QBrush *)local_100);
      local_128.d = (Data *)local_b8._0_8_;
      local_128.ptr = stack0xffffffffffffff50;
      local_f8.w = 0.0;
      local_f8.h = 0.0;
      local_f8.xp = 0.0;
      local_f8.yp = 0.0;
      fillBackground(painter,(QRectF *)local_58,&local_108,(QPointF *)&local_128,&local_f8);
      QBrush::~QBrush(&local_108);
    }
  }
  local_128.d = (Data *)0x0;
  local_128.ptr = (FormatRange *)0x0;
  local_128.size = 0;
  iVar8 = QTextBlock::position(bl);
  iVar9 = QTextBlock::length(bl);
  if ((context->selections).d.size == 0) {
    selectionFormat = (QTextCharFormat *)0x0;
  }
  else {
    lVar14 = 0;
    uVar18 = 0;
    selectionFormat = (QTextCharFormat *)0x0;
    do {
      pSVar2 = (context->selections).d.ptr;
      this_00 = (QTextCursor *)((long)&(pSVar2->cursor).d.d.ptr + lVar14);
      iVar10 = QTextCursor::selectionStart(this_00);
      iVar19 = iVar10 - iVar8;
      iVar11 = QTextCursor::selectionEnd(this_00);
      iVar17 = iVar11 - iVar8;
      if (((iVar10 < iVar11) && (iVar19 < iVar9)) && (0 < iVar17)) {
        local_58._16_4_ = -0x55555556;
        local_58._20_4_ = 0xaaaaaaaa;
        local_58._0_4_ = -0x55555556;
        local_58._4_4_ = -0x55555556;
        local_58._8_4_ = -0x55555556;
        local_58._12_4_ = -0x55555556;
        pQVar20 = (QTextFormat *)(local_58 + 8);
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)pQVar20);
        local_58._4_4_ = iVar17 - iVar19;
        local_58._0_4_ = iVar19;
        QTextFormat::operator=
                  (pQVar20,(QTextFormat *)
                           ((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar14));
        QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
        emplace<QTextLayout::FormatRange_const&>
                  ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_128,local_128.size,
                   (FormatRange *)local_58);
        QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_128);
        QTextFormat::~QTextFormat(pQVar20);
LAB_004f0b07:
      }
      else {
        bVar7 = QTextCursor::hasSelection(this_00);
        if (!bVar7) {
          pQVar20 = (QTextFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar14);
          bVar7 = QTextFormat::hasProperty(pQVar20,0x6000);
          if (bVar7) {
            iVar10 = QTextCursor::position(this_00);
            bVar7 = QTextBlock::contains(bl,iVar10);
            if (bVar7) {
              local_58._16_4_ = -0x55555556;
              local_58._20_4_ = 0xaaaaaaaa;
              local_58._0_4_ = -0x55555556;
              local_58._4_4_ = -0x55555556;
              local_58._8_4_ = -0x55555556;
              local_58._12_4_ = -0x55555556;
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_58 + 8));
              local_f8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_f8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              iVar10 = QTextCursor::position(this_00);
              QVar28 = QTextLayout::lineForTextPosition(this_03,iVar10 - iVar8);
              local_f8.yp = (qreal)QVar28.eng;
              local_f8.xp = (qreal)CONCAT44(local_f8.xp._4_4_,QVar28.index);
              local_58._0_4_ = QTextLine::textStart((QTextLine *)&local_f8);
              local_58._4_4_ = QTextLine::textLength((QTextLine *)&local_f8);
              if (local_58._0_4_ + local_58._4_4_ == iVar9 + -1) {
                local_58._4_4_ = local_58._4_4_ + 1;
              }
              QTextFormat::operator=((QTextFormat *)(local_58 + 8),pQVar20);
              QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
              emplace<QTextLayout::FormatRange_const&>
                        ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_128,local_128.size,
                         (FormatRange *)local_58);
              QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_128);
              QTextFormat::~QTextFormat((QTextFormat *)(local_58 + 8));
              goto LAB_004f0b07;
            }
          }
        }
      }
      pQVar21 = (QTextCharFormat *)((long)&(pSVar2->format).super_QTextFormat.d.d.ptr + lVar14);
      if (iVar17 < 1) {
        pQVar21 = selectionFormat;
      }
      if (-1 < iVar19) {
        pQVar21 = selectionFormat;
      }
      selectionFormat = pQVar21;
      uVar18 = uVar18 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar18 < (ulong)(context->selections).d.size);
  }
  this_01 = (this->super_QAbstractTextDocumentLayoutPrivate).document;
  QTextBlock::blockFormat((QTextBlock *)local_58);
  pQVar15 = QTextDocument::objectForFormat(this_01,(QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  if (pQVar15 == (QTextObject *)0x0) {
    bVar7 = false;
  }
  else {
    QTextObject::format((QTextObject *)&local_88);
    QTextFormat::toListFormat(&local_78);
    iVar10 = QTextFormat::intProperty(&local_78,0x3000);
    bVar7 = iVar10 != 0;
    QTextFormat::~QTextFormat(&local_78);
    QTextFormat::~QTextFormat(&local_88);
  }
  if (bVar7) {
    drawListItem(this,offset,painter,context,bl,selectionFormat);
  }
  local_130.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  p = QPainter::pen(painter);
  QPen::QPen(&local_130,p);
  pQVar16 = QPalette::brush(&context->palette,Current,Text);
  QPainter::setPen(painter,&((pQVar16->d)._M_t.
                             super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->color);
  if (((context->clip).w <= 0.0) || ((context->clip).h <= 0.0)) {
    qVar4 = (this->clipRect).xp;
    qVar5 = (this->clipRect).yp;
    local_58._16_8_ = (this->clipRect).w;
    pcStack_40 = (char *)(this->clipRect).h;
    local_58._0_4_ = SUB84(qVar4,0);
    local_58._4_4_ = (undefined4)((ulong)qVar4 >> 0x20);
    local_58._8_4_ = SUB84(qVar5,0);
    local_58._12_4_ = (undefined4)((ulong)qVar5 >> 0x20);
  }
  else {
    QRectF::operator&((QRectF *)local_58,&context->clip);
  }
  QTextLayout::draw(this_03,painter,offset,(QList<QTextLayout::FormatRange> *)&local_128,
                    (QRectF *)local_58);
  frameIteratorForTextPosition((Iterator *)local_58,this,iVar8);
  bVar7 = isEmptyBlockBeforeTable((Iterator *)local_58);
  if (bVar7) {
LAB_004f0e41:
    bVar7 = false;
    bVar22 = false;
  }
  else {
    iVar10 = context->cursorPosition;
    if (iVar10 < iVar8 || iVar9 + iVar8 <= iVar10) {
      if (-2 < iVar10) goto LAB_004f0e41;
      QTextLayout::preeditAreaText((QString *)(local_150 + 8),this_03);
      bVar22 = local_148.d.size != 0;
      bVar7 = true;
    }
    else {
      bVar22 = true;
      bVar7 = false;
    }
  }
  if ((bVar7) && ((Stream *)local_148.d.d != (Stream *)0x0)) {
    LOCK();
    *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
    UNLOCK();
    if (*(int *)local_148.d.d == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar22) {
    iVar9 = context->cursorPosition;
    if (iVar9 < -1) {
      iVar8 = QTextLayout::preeditAreaPosition(this_03);
      iVar9 = (iVar8 - iVar9) + -2;
    }
    else {
      iVar9 = iVar9 - iVar8;
    }
    QTextLayout::drawCursor(this_03,painter,offset,iVar9,this->cursorWidth);
  }
  bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x1060);
  if (bVar7) {
    QVar31 = QTextFormat::lengthProperty((QTextFormat *)local_68,0x1060);
    TVar12 = QVar31.lengthType;
    dVar23 = (double)CONCAT44(uStack_a4,local_a8);
    if (TVar12 != VariableLength) {
      dVar23 = QVar31.fixedValueOrPercentage;
      if (TVar12 == PercentageLength) {
        dVar23 = (dVar23 * (double)CONCAT44(uStack_a4,local_a8)) / 100.0;
      }
      else if (TVar12 != FixedLength) {
        dVar23 = -1.0;
      }
    }
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x820);
    if (bVar7) {
      QTextFormat::property((QVariant *)local_58,(QTextFormat *)local_68,0x820);
      v = (QVariant *)local_150;
      qvariant_cast<QBrush>(v);
    }
    else {
      v = (QVariant *)QPalette::brush(&context->palette,Inactive,WindowText);
    }
    pPVar3 = (v->d).data.shared;
    local_98 = *(undefined1 **)(pPVar3 + 8);
    puStack_90 = *(undefined1 **)(pPVar3 + 0x10);
    if (bVar7) {
      QBrush::~QBrush((QBrush *)local_150);
      ::QVariant::~QVariant((QVariant *)local_58);
    }
    QPainter::setPen(painter,(QColor *)&local_98);
    pQVar24 = (QTextEngine *)
              ((double)stack0xffffffffffffff50 + (double)CONCAT44(uStack_9c,uStack_a0));
    iVar8 = QTextBlock::length(bl);
    if (iVar8 == 1) {
      pQVar24 = (QTextEngine *)
                ((double)CONCAT44(uStack_9c,uStack_a0) * 0.5 + (double)stack0xffffffffffffff50);
    }
    local_f8.w = (double)CONCAT44(uStack_a4,local_a8) * 0.5 + (double)local_b8._0_8_;
    local_f8.xp = local_f8.w - dVar23 * 0.5;
    local_f8.w = local_f8.w + dVar23 * 0.5;
    local_f8.yp = (qreal)pQVar24;
    local_f8.h = (qreal)pQVar24;
    QPainter::drawLines(painter,(QLineF *)&local_f8,1);
  }
  QPainter::setPen(painter,&local_130);
  QPen::~QPen(&local_130);
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_128);
  QBrush::~QBrush((QBrush *)local_100);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
LAB_004f10d7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawBlock(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           const QTextBlock &bl, bool inRootFrame) const
{
    const QTextLayout *tl = bl.layout();
    QRectF r = tl->boundingRect();
    r.translate(offset + tl->position());
    if (!bl.isVisible() || (context.clip.isValid() && (r.bottom() < context.clip.y() || r.top() > context.clip.bottom())))
        return;
    qCDebug(lcDraw) << "drawBlock" << bl.position() << "at" << offset << "br" << tl->boundingRect();

    QTextBlockFormat blockFormat = bl.blockFormat();

    QBrush bg = blockFormat.background();
    if (bg != Qt::NoBrush) {
        QRectF rect = r;

        // extend the background rectangle if we're in the root frame with NoWrap,
        // as the rect of the text block will then be only the width of the text
        // instead of the full page width
        if (inRootFrame && document->pageSize().width() <= 0) {
            const QTextFrameData *fd = data(document->rootFrame());
            rect.setRight((fd->size.width - fd->rightMargin).toReal());
        }

        // in the case of <hr>, the background-color CSS style fills only the rule's thickness instead of the whole line
        if (!blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth))
            fillBackground(painter, rect, bg, r.topLeft());
    }

    QList<QTextLayout::FormatRange> selections;
    int blpos = bl.position();
    int bllen = bl.length();
    const QTextCharFormat *selFormat = nullptr;
    for (int i = 0; i < context.selections.size(); ++i) {
        const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
        const int selStart = range.cursor.selectionStart() - blpos;
        const int selEnd = range.cursor.selectionEnd() - blpos;
        if (selStart < bllen && selEnd > 0
             && selEnd > selStart) {
            QTextLayout::FormatRange o;
            o.start = selStart;
            o.length = selEnd - selStart;
            o.format = range.format;
            selections.append(o);
        } else if (! range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                   && bl.contains(range.cursor.position())) {
            // for full width selections we don't require an actual selection, just
            // a position to specify the line. that's more convenience in usage.
            QTextLayout::FormatRange o;
            QTextLine l = tl->lineForTextPosition(range.cursor.position() - blpos);
            o.start = l.textStart();
            o.length = l.textLength();
            if (o.start + o.length == bllen - 1)
                ++o.length; // include newline
            o.format = range.format;
            selections.append(o);
       }
        if (selStart < 0 && selEnd >= 1)
            selFormat = &range.format;
    }

    QTextObject *object = document->objectForFormat(bl.blockFormat());
    if (object && object->format().toListFormat().style() != QTextListFormat::ListStyleUndefined)
        drawListItem(offset, painter, context, bl, selFormat);

    QPen oldPen = painter->pen();
    painter->setPen(context.palette.color(QPalette::Text));

    tl->draw(painter, offset, selections, context.clip.isValid() ? (context.clip & clipRect) : clipRect);

    // if the block is empty and it precedes a table, do not draw the cursor.
    // the cursor is drawn later after the table has been drawn so no need
    // to draw it here.
    if (!isEmptyBlockBeforeTable(frameIteratorForTextPosition(blpos))
        && ((context.cursorPosition >= blpos && context.cursorPosition < blpos + bllen)
            || (context.cursorPosition < -1 && !tl->preeditAreaText().isEmpty()))) {
        int cpos = context.cursorPosition;
        if (cpos < -1)
            cpos = tl->preeditAreaPosition() - (cpos + 2);
        else
            cpos -= blpos;
        tl->drawCursor(painter, offset, cpos, cursorWidth);
    }

    if (blockFormat.hasProperty(QTextFormat::BlockTrailingHorizontalRulerWidth)) {
        const qreal width = blockFormat.lengthProperty(QTextFormat::BlockTrailingHorizontalRulerWidth).value(r.width());
        const auto color = blockFormat.hasProperty(QTextFormat::BackgroundBrush)
                         ? qvariant_cast<QBrush>(blockFormat.property(QTextFormat::BackgroundBrush)).color()
                         : context.palette.color(QPalette::Inactive, QPalette::WindowText);
        painter->setPen(color);
        qreal y = r.bottom();
        if (bl.length() == 1)
            y = r.top() + r.height() / 2;

        const qreal middleX = r.left() + r.width() / 2;
        painter->drawLine(QLineF(middleX - width / 2, y, middleX + width / 2, y));
    }

    painter->setPen(oldPen);
}